

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istack.c
# Opt level: O3

void PopIStack(TidyDocImpl *doc)

{
  Lexer *pLVar1;
  IStack *pIVar2;
  uint uVar3;
  AttVal *av;
  
  pLVar1 = doc->lexer;
  uVar3 = pLVar1->istacksize - 1;
  pLVar1->istacksize = uVar3;
  pIVar2 = pLVar1->istack;
  av = pIVar2[uVar3].attributes;
  while (av != (AttVal *)0x0) {
    pIVar2[uVar3].attributes = av->next;
    prvTidyFreeAttribute(doc,av);
    av = pIVar2[uVar3].attributes;
  }
  (*doc->allocator->vtbl->free)(doc->allocator,pIVar2[uVar3].element);
  pIVar2[uVar3].element = (tmbstr)0x0;
  return;
}

Assistant:

static void PopIStack( TidyDocImpl* doc )
{
    Lexer* lexer = doc->lexer;
    IStack *istack;
    AttVal *av;

    --(lexer->istacksize);
    istack = &(lexer->istack[lexer->istacksize]);

    while (istack->attributes)
    {
        av = istack->attributes;
        istack->attributes = av->next;
        TY_(FreeAttribute)( doc, av );
    }
    TidyDocFree(doc, istack->element);
    istack->element = NULL; /* remove the freed element */
}